

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_get_client_ID_Test::TestBody
          (WelcomeMessageTest_test_get_client_ID_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_48;
  Message local_40 [3];
  uint local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  WelcomeMessageTest_test_get_client_ID_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_24 = bidfx_public_api::price::pixie::WelcomeMessage::GetClientID();
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_20,"CLIENT_ID","WELCOME_MESSAGE.GetClientID()",&CLIENT_ID,
             &local_24);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_get_client_ID)
{
    ASSERT_EQ(CLIENT_ID, WELCOME_MESSAGE.GetClientID());
}